

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_chasm_bin.cpp
# Opt level: O3

bool __thiscall FChasmBinFile::ReadNextEntry(FChasmBinFile *this,DWORD index)

{
  uint uVar1;
  FileReader *pFVar2;
  undefined4 uVar3;
  DWORD DVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar7;
  MemoryLump *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t __n;
  ulong uVar8;
  bool bVar9;
  ChasmBinEntry entry;
  ChasmBinEntry CStack_78;
  undefined4 local_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  int local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pFVar2 = (this->super_FResourceFile).Reader;
  iVar5 = (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&CStack_78,0x15);
  if (CONCAT44(extraout_var,iVar5) != 0x15) goto LAB_006310da;
  CStack_78.name[0] = CStack_78.name[1];
  CStack_78.name._1_7_ = SUB87(CONCAT17(CStack_78.name[8],CStack_78.name._1_7_) >> 8,0);
  uVar3._3_1_ = CStack_78.name[0xc];
  uVar3._0_1_ = CStack_78.name[9];
  uVar3._1_1_ = CStack_78.name[10];
  uVar3._2_1_ = CStack_78.name[0xb];
  CStack_78.name[0xc] = '\0';
  CStack_78.name._8_4_ = uVar3;
  pcVar7 = strrchr(CStack_78.name,0x2e);
  pcVar7 = pcVar7 + 1;
  iVar6 = strcmp("PCM",pcVar7);
  if (iVar6 == 0) {
LAB_00630f86:
    DVar4 = CStack_78.size;
    uVar8 = (ulong)CStack_78.size;
    this_00 = (MemoryLump *)operator_new(0x60);
    anon_unknown.dwarf_8edd3d::MemoryLump::MemoryLump(this_00,uVar8 + 0x2c);
    (this_00->super_FResourceLump).Namespace = 0xd;
    pcVar7 = this_00->m_buffer;
    pcVar7[0] = 'R';
    pcVar7[1] = 'I';
    pcVar7[2] = 'F';
    pcVar7[3] = 'F';
    *(DWORD *)(pcVar7 + 4) = DVar4 + 0x24;
    pcVar7[8] = 'W';
    pcVar7[9] = 'A';
    pcVar7[10] = 'V';
    pcVar7[0xb] = 'E';
    pcVar7[0xc] = 'f';
    pcVar7[0xd] = 'm';
    pcVar7[0xe] = 't';
    pcVar7[0xf] = ' ';
    pcVar7[0x10] = '\x10';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pcVar7[0x14] = '\x01';
    pcVar7[0x15] = '\0';
    pcVar7[0x16] = '\x01';
    pcVar7[0x17] = '\0';
    pcVar7[0x18] = '\x11';
    pcVar7[0x19] = '+';
    pcVar7[0x1a] = '\0';
    pcVar7[0x1b] = '\0';
    pcVar7[0x1c] = '\x11';
    pcVar7[0x1d] = '+';
    pcVar7[0x1e] = '\0';
    pcVar7[0x1f] = '\0';
    pcVar7[0x20] = '\x01';
    pcVar7[0x21] = '\0';
    pcVar7[0x22] = '\b';
    pcVar7[0x23] = '\0';
    pcVar7[0x24] = 'd';
    pcVar7[0x25] = 'a';
    pcVar7[0x26] = 't';
    pcVar7[0x27] = 'a';
    *(DWORD *)(pcVar7 + 0x28) = DVar4;
    iVar6 = (*(((this->super_FResourceFile).Reader)->super_FileReaderBase)._vptr_FileReaderBase[3])
                      ();
    pFVar2 = (this->super_FResourceFile).Reader;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,(ulong)CStack_78.offset,0);
    pFVar2 = (this->super_FResourceFile).Reader;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])
              (pFVar2,pcVar7 + 0x2c,(ulong)CStack_78.size);
    pFVar2 = (this->super_FResourceFile).Reader;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])
              (pFVar2,CONCAT44(extraout_var_00,iVar6),0);
    AddEntryToSoundInfo(this,&CStack_78);
LAB_00631054:
    bVar9 = true;
  }
  else {
    iVar6 = strcmp("RAW",pcVar7);
    if (iVar6 == 0) goto LAB_00630f86;
    iVar6 = strcmp("SFX",pcVar7);
    if (iVar6 == 0) goto LAB_00630f86;
    iVar6 = strcmp("WAV",pcVar7);
    if (iVar6 == 0) {
      iVar6 = (*(((this->super_FResourceFile).Reader)->super_FileReaderBase)._vptr_FileReaderBase[3]
              )();
      pFVar2 = (this->super_FResourceFile).Reader;
      (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,(ulong)CStack_78.offset,0);
      pFVar2 = (this->super_FResourceFile).Reader;
      (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&local_5c,0x2c);
      if (local_4c == 0x10) {
        this_00 = (MemoryLump *)operator_new(0x50);
        (this_00->super_FResourceLump).FullName.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        (this_00->super_FResourceLump).Flags = '\0';
        (this_00->super_FResourceLump).RefCount = '\0';
        (this_00->super_FResourceLump).field_3.Name[0] = '\0';
        (this_00->super_FResourceLump).Cache = (char *)0x0;
        (this_00->super_FResourceLump).Owner = (FResourceFile *)0x0;
        *(undefined8 *)((long)&(this_00->super_FResourceLump).Owner + 4) = 0;
        *(undefined8 *)((long)&(this_00->super_FResourceLump).LinkedTexture + 4) = 0;
        (this_00->super_FResourceLump)._vptr_FResourceLump =
             (_func_int **)&PTR__FResourceLump_0088bf20;
        *(DWORD *)&(this_00->super_FResourceLump).field_0x4c = CStack_78.offset;
      }
      else {
        local_4c = 0x10;
        this_00 = (MemoryLump *)operator_new(0x60);
        anon_unknown.dwarf_8edd3d::MemoryLump::MemoryLump(this_00,(ulong)CStack_78.size);
        pcVar7 = this_00->m_buffer;
        *(undefined4 *)(pcVar7 + 0x1c) = uStack_40;
        *(undefined4 *)(pcVar7 + 0x20) = uStack_3c;
        *(undefined4 *)(pcVar7 + 0x24) = uStack_38;
        *(undefined4 *)(pcVar7 + 0x28) = uStack_34;
        *(int *)(pcVar7 + 0x10) = local_4c;
        *(undefined4 *)(pcVar7 + 0x14) = uStack_48;
        *(undefined4 *)(pcVar7 + 0x18) = uStack_44;
        *(undefined4 *)(pcVar7 + 0x1c) = uStack_40;
        *(undefined4 *)pcVar7 = local_5c;
        *(undefined4 *)(pcVar7 + 4) = uStack_58;
        *(undefined4 *)(pcVar7 + 8) = uStack_54;
        *(undefined4 *)(pcVar7 + 0xc) = uStack_50;
        pFVar2 = (this->super_FResourceFile).Reader;
        (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])
                  (pFVar2,pcVar7 + 0x2c,(ulong)CStack_78.size - 0x2c);
      }
      (this_00->super_FResourceLump).Namespace = 0xd;
      AddEntryToSoundInfo(this,&CStack_78);
      pFVar2 = (this->super_FResourceFile).Reader;
      (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])
                (pFVar2,CONCAT44(extraout_var_01,iVar6),0);
      goto LAB_00631054;
    }
    this_00 = (MemoryLump *)operator_new(0x50);
    (this_00->super_FResourceLump).FullName.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    (this_00->super_FResourceLump).Flags = '\0';
    (this_00->super_FResourceLump).RefCount = '\0';
    (this_00->super_FResourceLump).field_3.Name[0] = '\0';
    (this_00->super_FResourceLump).Cache = (char *)0x0;
    (this_00->super_FResourceLump).Owner = (FResourceFile *)0x0;
    *(undefined8 *)((long)&(this_00->super_FResourceLump).Owner + 4) = 0;
    *(undefined8 *)((long)&(this_00->super_FResourceLump).LinkedTexture + 4) = 0;
    (this_00->super_FResourceLump)._vptr_FResourceLump = (_func_int **)&PTR__FResourceLump_0088bf20;
    *(DWORD *)&(this_00->super_FResourceLump).field_0x4c = CStack_78.offset;
    iVar6 = strcmp("CEL",pcVar7);
    bVar9 = iVar6 == 0;
  }
  (this_00->super_FResourceLump).Owner = &this->super_FResourceFile;
  (this_00->super_FResourceLump).LumpSize = CStack_78.size;
  pcVar7 = copystring(CStack_78.name);
  FString::operator=(&(this_00->super_FResourceLump).FullName,pcVar7);
  if (bVar9) {
    (this_00->super_FResourceLump).field_3.Name[8] = '\0';
    (this_00->super_FResourceLump).field_3.qwName = 0;
    pcVar7 = strrchr(CStack_78.name,0x2e);
    __n = 8;
    if (pcVar7 != (char *)0x0) {
      __n = (long)pcVar7 - (long)&CStack_78;
    }
    strncpy((this_00->super_FResourceLump).field_3.Name,CStack_78.name,__n);
  }
  TArray<FResourceLump_*,_FResourceLump_*>::Grow(&this->m_lumps,1);
  uVar1 = (this->m_lumps).Count;
  (this->m_lumps).Array[uVar1] = &this_00->super_FResourceLump;
  (this->m_lumps).Count = uVar1 + 1;
LAB_006310da:
  return CONCAT44(extraout_var,iVar5) == 0x15;
}

Assistant:

bool FChasmBinFile::ReadNextEntry(const DWORD index)
{
	ChasmBinEntry entry;

	const long bytesRead = Reader->Read(&entry, long(sizeof entry));
	if (size_t(bytesRead) != sizeof entry)
	{
		return false;
	}

	// Convert Pascal string to zero-terminated
	memmove(entry.name, &entry.name[1], sizeof entry.name - 1);
	entry.name[sizeof entry.name - 1] = '\0';

	FResourceLump* lump = NULL;
	bool supportedFormat = false;

	if (   HasExtension(entry.name, "PCM")
		|| HasExtension(entry.name, "RAW")
		|| HasExtension(entry.name, "SFX"))
	{
		lump = MakeRawSoundLump(entry);
		supportedFormat = true;
	}
	else if (HasExtension(entry.name, "WAV"))
	{
		lump = MakeWaveSoundLump(entry);
		supportedFormat = true;
	}
	else
	{
		lump = MakeUncompressedLump(entry);
		supportedFormat = HasExtension(entry.name, "CEL");
	}

	// Set common lump parameters

	lump->Owner    = this;
	lump->LumpSize = LittleLong(entry.size);
	lump->FullName = copystring(entry.name);

	// TODO: namespace

	if (supportedFormat)
	{
		CopyBaseName(lump->Name, entry.name);
	}

	m_lumps.Push(lump);

	return true;
}